

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O0

arena_t * arena_get(tsdn_t *tsdn,uint ind,_Bool init_if_missing)

{
  byte in_DL;
  uint in_ESI;
  arena_t *ret;
  void *result;
  undefined4 in_stack_ffffffffffffffb0;
  arena_t *paStack_38;
  
  paStack_38 = (arena_t *)arenas[in_ESI].repr;
  if ((paStack_38 == (arena_t *)0x0) && ((in_DL & 1) != 0)) {
    paStack_38 = arena_init((tsdn_t *)0x1,(uint)((ulong)(arenas + in_ESI) >> 0x20),
                            (extent_hooks_t *)CONCAT44(2,in_stack_ffffffffffffffb0));
  }
  return paStack_38;
}

Assistant:

static inline arena_t *
arena_get(tsdn_t *tsdn, unsigned ind, bool init_if_missing) {
	arena_t *ret;

	assert(ind < MALLOCX_ARENA_LIMIT);

	ret = (arena_t *)atomic_load_p(&arenas[ind], ATOMIC_ACQUIRE);
	if (unlikely(ret == NULL)) {
		if (init_if_missing) {
			ret = arena_init(tsdn, ind,
			    (extent_hooks_t *)&extent_hooks_default);
		}
	}
	return ret;
}